

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_meshb_glob(FILE *file,REF_INT version,REF_GLOB value)

{
  size_t sVar1;
  undefined8 uVar2;
  char *pcVar3;
  int int_value;
  long long_value;
  undefined4 local_c;
  REF_GLOB local_8;
  
  if (version < 4) {
    local_c = (undefined4)value;
    sVar1 = fwrite(&local_c,4,1,(FILE *)file);
    if (sVar1 == 1) {
      return 0;
    }
    pcVar3 = "int value";
    uVar2 = 0x494;
  }
  else {
    local_8 = value;
    sVar1 = fwrite(&local_8,8,1,(FILE *)file);
    if (sVar1 == 1) {
      return 0;
    }
    pcVar3 = "long value";
    uVar2 = 0x497;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar2,
         "ref_gather_meshb_glob",pcVar3,1,sVar1);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_meshb_glob(FILE *file, REF_INT version,
                                                REF_GLOB value) {
  int int_value;
  long long_value;
  if (version < 4) {
    int_value = (int)value;
    REIS(1, fwrite(&int_value, sizeof(int), 1, file), "int value");
  } else {
    long_value = (long)value;
    REIS(1, fwrite(&long_value, sizeof(long), 1, file), "long value");
  }
  return REF_SUCCESS;
}